

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdVerifyMessage(void *handle,char *signature,char *pubkey,char *message,char *magic,
                    char **recovered_pubkey)

{
  bool bVar1;
  undefined8 uVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  bool is_success;
  Pubkey recoverable_pubkey;
  ByteData signature_obj;
  Pubkey pubkey_obj;
  undefined6 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  undefined8 in_stack_fffffffffffffc98;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffca0;
  allocator *paVar5;
  string *in_stack_fffffffffffffce0;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  byte local_1f9;
  Pubkey local_1f8;
  undefined1 local_1d9 [33];
  ByteData local_1b8;
  allocator local_199;
  string local_198;
  ByteData local_178;
  ByteData local_160;
  allocator local_141;
  string local_140;
  Pubkey local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  undefined8 *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x6b1;
    local_60.funcname = "CfdVerifyMessage";
    cfd::core::logger::warn<>(&local_60,"signature is null or empty.");
    local_82 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,"Failed to parameter. signature is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffca0,error_code,
               (string *)
               CONCAT17(in_stack_fffffffffffffc97,
                        CONCAT16(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90)));
    local_82 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x6b7;
    local_a0.funcname = "CfdVerifyMessage";
    cfd::core::logger::warn<>(&local_a0,"pubkey is null or empty.");
    local_c2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Failed to parameter. pubkey is null or empty.",&local_c1)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffca0,error_code,
               (string *)
               CONCAT17(in_stack_fffffffffffffc97,
                        CONCAT16(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90)));
    local_c2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x6bd;
    local_e0.funcname = "CfdVerifyMessage";
    cfd::core::logger::warn<>(&local_e0,"message is null or empty.");
    local_102 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Failed to parameter. message is null or empty.",&local_101);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffca0,error_code,
               (string *)
               CONCAT17(in_stack_fffffffffffffc97,
                        CONCAT16(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90)));
    local_102 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,local_20,&local_141);
  cfd::core::Pubkey::Pubkey(&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  cfd::core::ByteData::ByteData(&local_160);
  sVar3 = strnlen(local_18,0x84);
  if (sVar3 == 0x82) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,local_18,&local_199);
    cfd::core::ByteData::ByteData(&local_178,&local_198);
    cfd::core::ByteData::operator=(&local_160,&local_178);
    cfd::core::ByteData::~ByteData((ByteData *)0x60ddcb);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  else {
    in_stack_fffffffffffffce0 = (string *)local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1d9 + 1),local_18,(allocator *)in_stack_fffffffffffffce0);
    cfd::core::CryptoUtil::DecodeBase64(&local_1b8,(string *)(local_1d9 + 1));
    cfd::core::ByteData::operator=(&local_160,&local_1b8);
    cfd::core::ByteData::~ByteData((ByteData *)0x60df2b);
    std::__cxx11::string::~string((string *)(local_1d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1d9);
  }
  cfd::core::Pubkey::Pubkey(&local_1f8);
  local_1f9 = 0;
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,local_28,&local_221);
    local_1f9 = cfd::core::Pubkey::VerifyBitcoinMessage(&local_120,&local_160,&local_220,&local_1f8)
    ;
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,local_28,&local_249);
    paVar5 = &local_271;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,local_30,paVar5);
    local_1f9 = cfd::core::Pubkey::VerifyMessage
                          (&local_120,&local_160,&local_248,&local_270,&local_1f8);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
  }
  if ((local_38 != (undefined8 *)0x0) && (bVar1 = cfd::core::Pubkey::IsValid(&local_1f8), bVar1)) {
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_298,&local_1f8);
    pcVar4 = cfd::capi::CreateString(in_stack_fffffffffffffce0);
    *local_38 = pcVar4;
    std::__cxx11::string::~string((string *)&local_298);
  }
  if ((local_1f9 & 1) == 0) {
    local_4 = 7;
  }
  else {
    local_4 = 0;
  }
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x60e331);
  cfd::core::ByteData::~ByteData((ByteData *)0x60e33e);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x60e34b);
  return local_4;
}

Assistant:

int CfdVerifyMessage(
    void* handle, const char* signature, const char* pubkey,
    const char* message, const char* magic, char** recovered_pubkey) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(message)) {
      warn(CFD_LOG_SOURCE, "message is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. message is null or empty.");
    }
    Pubkey pubkey_obj(pubkey);
    ByteData signature_obj;
    if (strnlen(signature, 132) == 130) {
      signature_obj = ByteData(signature);
    } else {
      signature_obj = CryptoUtil::DecodeBase64(signature);
    }

    Pubkey recoverable_pubkey;
    bool is_success = false;
    if (IsEmptyString(magic)) {
      is_success = pubkey_obj.VerifyBitcoinMessage(
          signature_obj, message, &recoverable_pubkey);
    } else {
      is_success = pubkey_obj.VerifyMessage(
          signature_obj, message, magic, &recoverable_pubkey);
    }
    if ((recovered_pubkey != nullptr) && recoverable_pubkey.IsValid()) {
      *recovered_pubkey = CreateString(recoverable_pubkey.GetHex());
    }

    if (!is_success) return CfdErrorCode::kCfdSignVerificationError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}